

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_UInt16 addNamespace(UA_Server *server,UA_String name)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  UA_String *pUVar3;
  UA_StatusCode retval;
  UA_String *newNS;
  UA_UInt16 i;
  UA_Server *server_local;
  UA_String name_local;
  
  name_local.length = (size_t)name.data;
  server_local = (UA_Server *)name.length;
  newNS._6_2_ = 0;
  while( true ) {
    if (server->namespacesSize <= (ulong)newNS._6_2_) {
      pUVar3 = (UA_String *)realloc(server->namespaces,(server->namespacesSize + 1) * 0x10);
      if (pUVar3 == (UA_String *)0x0) {
        name_local.data._6_2_ = 0;
      }
      else {
        server->namespaces = pUVar3;
        UVar2 = UA_String_copy((UA_String *)&server_local,
                               server->namespaces + server->namespacesSize);
        if (UVar2 == 0) {
          server->namespacesSize = server->namespacesSize + 1;
          name_local.data._6_2_ = (short)server->namespacesSize - 1;
        }
        else {
          name_local.data._6_2_ = 0;
        }
      }
      return name_local.data._6_2_;
    }
    UVar1 = UA_String_equal((UA_String *)&server_local,server->namespaces + newNS._6_2_);
    if (UVar1) break;
    newNS._6_2_ = newNS._6_2_ + 1;
  }
  return newNS._6_2_;
}

Assistant:

UA_UInt16 addNamespace(UA_Server *server, const UA_String name) {
    /* Check if the namespace already exists in the server's namespace array */
    for(UA_UInt16 i=0;i<server->namespacesSize;++i) {
        if(UA_String_equal(&name, &server->namespaces[i]))
            return i;
    }

    /* Add a new namespace to the namsepace array */
    UA_String *newNS = UA_realloc(server->namespaces,
                                  sizeof(UA_String) * (server->namespacesSize + 1));
    if(!newNS)
        return 0;
    server->namespaces = newNS;
    UA_StatusCode retval = UA_String_copy(&name, &server->namespaces[server->namespacesSize]);
    if(retval != UA_STATUSCODE_GOOD)
        return 0;
    ++server->namespacesSize;
    return (UA_UInt16)(server->namespacesSize - 1);
}